

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaGrammar.hpp
# Opt level: O0

XMLNotationDecl * __thiscall
xercesc_4_0::SchemaGrammar::getNotationDecl(SchemaGrammar *this,XMLCh *notName)

{
  XMLNotationDecl *pXVar1;
  XMLCh *notName_local;
  SchemaGrammar *this_local;
  
  pXVar1 = NameIdPool<xercesc_4_0::XMLNotationDecl>::getByKey(this->fNotationDeclPool,notName);
  return pXVar1;
}

Assistant:

inline const XMLNotationDecl* SchemaGrammar::getNotationDecl(const XMLCh* const notName) const
{
    return fNotationDeclPool->getByKey(notName);
}